

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::TypedExpectation<bool_()>::~TypedExpectation(TypedExpectation<bool_()> *this)

{
  Action<bool_()> *this_00;
  bool bVar1;
  reference ppvVar2;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_28;
  __normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_20;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_18;
  const_iterator it;
  TypedExpectation<bool_()> *this_local;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_005bc6a0;
  it._M_current = (void **)this;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  local_20._M_current =
       (void **)std::vector<const_void_*,_std::allocator<const_void_*>_>::begin
                          (&(this->super_ExpectationBase).untyped_actions_);
  __gnu_cxx::
  __normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>::
  __normal_iterator<void_const**>
            ((__normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>
              *)&local_18,&local_20);
  while( true ) {
    local_28._M_current =
         (void **)std::vector<const_void_*,_std::allocator<const_void_*>_>::end
                            (&(this->super_ExpectationBase).untyped_actions_);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              ::operator*(&local_18);
    this_00 = (Action<bool_()> *)*ppvVar2;
    if (this_00 != (Action<bool_()> *)0x0) {
      Action<bool_()>::~Action(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
    ::operator++(&local_18);
  }
  Action<bool_()>::~Action(&this->repeated_action_);
  Matcher<const_std::tuple<>_&>::~Matcher(&this->extra_matcher_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

~TypedExpectation() override {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }